

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_Vx_annotation.cpp
# Opt level: O3

void __thiscall
ON_OBSOLETE_V5_Annotation::Internal_InitializeFromV2Annotation
          (ON_OBSOLETE_V5_Annotation *this,ON_OBSOLETE_V2_Annotation *V2_annotation,
          ON_3dmAnnotationContext *annotation_context)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  wchar_t *text_value;
  long lVar4;
  int iVar5;
  ON_wString *src;
  ON_Plane *pOVar6;
  ON_Plane *pOVar7;
  ON_Plane *this_00;
  uint uVar8;
  byte bVar9;
  ON_2dVector OVar10;
  ON_2dPoint OVar11;
  ON_wString text;
  ON_2dVector v;
  ON_2dPoint v5_point;
  ON_2dPoint V2_point;
  ON_wString local_e0;
  ON_2dVector local_d8;
  ON_2dPoint local_c8;
  ON_3dmAnnotationContext *local_b8;
  ON_Plane local_b0;
  
  bVar9 = 0;
  if (annotation_context == (ON_3dmAnnotationContext *)0x0) {
    annotation_context = &ON_3dmAnnotationContext::Default;
  }
  local_b8 = annotation_context;
  SetTextFormula(this,(wchar_t *)0x0);
  bVar1 = ON_wString::IsNotEmpty(&V2_annotation->m_usertext);
  src = &V2_annotation->m_defaulttext;
  if (bVar1) {
    src = &V2_annotation->m_usertext;
  }
  ON_wString::ON_wString(&local_e0,src);
  ON_wString::TrimLeftAndRight(&local_e0,(wchar_t *)0x0);
  text_value = ON_wString::operator_cast_to_wchar_t_(&local_e0);
  SetTextValue(this,text_value);
  uVar2 = ON_OBSOLETE_V2_Annotation::PointCount(V2_annotation);
  if (((int)uVar2 < 1) ||
     (bVar1 = ON_2dPoint::IsValid((V2_annotation->m_points).m_a),
     !bVar1 || V2_annotation->m_type == dtDimAngular)) {
    local_d8.x = ON_2dVector::ZeroVector.x;
    local_d8.y = ON_2dVector::ZeroVector.y;
  }
  else {
    OVar10 = ON_2dPoint::operator-(&ON_2dPoint::Origin,(V2_annotation->m_points).m_a);
    local_d8.y = OVar10.y;
    local_d8.x = OVar10.x;
  }
  uVar8 = (this->m_points).super_ON_SimpleArray<ON_2dPoint>.m_capacity;
  if (-1 < (int)uVar8) {
    (this->m_points).super_ON_SimpleArray<ON_2dPoint>.m_count = 0;
  }
  if (uVar8 < uVar2) {
    ON_SimpleArray<ON_2dPoint>::SetCapacity
              (&(this->m_points).super_ON_SimpleArray<ON_2dPoint>,(long)(int)uVar2);
  }
  if ((0 < (int)uVar2) &&
     (ON_SimpleArray<ON_2dPoint>::Append
                (&(this->m_points).super_ON_SimpleArray<ON_2dPoint>,&ON_2dPoint::Origin), uVar2 != 1
     )) {
    uVar8 = 1;
    do {
      OVar11 = ON_OBSOLETE_V2_Annotation::Point(V2_annotation,uVar8);
      local_b0.origin.y = OVar11.y;
      local_b0.origin.x = OVar11.x;
      bVar1 = ON_2dPoint::IsValid((ON_2dPoint *)&local_b0);
      if (bVar1) {
        OVar11 = ON_2dPoint::operator+((ON_2dPoint *)&local_b0,&local_d8);
        local_c8.y = OVar11.y;
        local_c8.x = OVar11.x;
      }
      else {
        local_c8.x = local_b0.origin.x;
        local_c8.y = local_b0.origin.y;
      }
      SetPoint(this,uVar8,&local_c8);
      uVar8 = uVar8 + 1;
    } while (uVar2 != uVar8);
  }
  ON_OBSOLETE_V2_Annotation::Plane(&local_b0,V2_annotation);
  this_00 = &this->m_plane;
  pOVar6 = &local_b0;
  pOVar7 = this_00;
  for (lVar4 = 0x10; lVar4 != 0; lVar4 = lVar4 + -1) {
    (pOVar7->origin).x = (pOVar6->origin).x;
    pOVar6 = (ON_Plane *)((long)pOVar6 + (ulong)bVar9 * -0x10 + 8);
    pOVar7 = (ON_Plane *)((long)pOVar7 + (ulong)bVar9 * -0x10 + 8);
  }
  ON_Plane::~ON_Plane(&local_b0);
  ON_Plane::UpdateEquation(this_00);
  bVar1 = ON_Plane::IsValid(this_00);
  if (bVar1) {
    bVar1 = ON_2dVector::IsNotZero(&local_d8);
    if (bVar1) {
      ON_Plane::PointAt(&local_b0.origin,this_00,-local_d8.x,-local_d8.y);
      (this->m_plane).origin.z = local_b0.origin.z;
      (this_00->origin).x = local_b0.origin.x;
      (this->m_plane).origin.y = local_b0.origin.y;
      ON_Plane::UpdateEquation(this_00);
    }
  }
  else {
    pOVar6 = &ON_Plane::World_xy;
    for (lVar4 = 0x10; lVar4 != 0; lVar4 = lVar4 + -1) {
      (this_00->origin).x = (pOVar6->origin).x;
      pOVar6 = (ON_Plane *)((long)pOVar6 + ((ulong)bVar9 * -2 + 1) * 8);
      this_00 = (ON_Plane *)((long)this_00 + (ulong)bVar9 * -0x10 + 8);
    }
  }
  this->m_textheight = 1.0;
  bVar1 = false;
  switch(V2_annotation->m_type) {
  case dtDimLinear:
  case dtDimAligned:
    iVar3 = 5;
    iVar5 = 5;
    goto LAB_004b5e03;
  case dtDimAngular:
    bVar1 = ON_OBSOLETE_V2_Annotation::UserPositionedText(V2_annotation);
    iVar5 = 3;
    iVar3 = 2;
LAB_004b5e03:
    this->m_textdisplaymode = kAboveLine;
    this->m_userpositionedtext = bVar1;
    if (iVar5 < (this->m_points).super_ON_SimpleArray<ON_2dPoint>.m_count) {
      if (iVar5 <= (this->m_points).super_ON_SimpleArray<ON_2dPoint>.m_capacity) {
        (this->m_points).super_ON_SimpleArray<ON_2dPoint>.m_count = iVar5;
      }
    }
    else {
LAB_004b5e35:
      if (((this->m_points).super_ON_SimpleArray<ON_2dPoint>.m_count < iVar3) &&
         (-1 < (this->m_points).super_ON_SimpleArray<ON_2dPoint>.m_capacity)) {
        (this->m_points).super_ON_SimpleArray<ON_2dPoint>.m_count = 0;
      }
    }
    goto LAB_004b5e62;
  case dtDimDiameter:
  case dtDimRadius:
    bVar1 = ON_OBSOLETE_V2_Annotation::UserPositionedText(V2_annotation);
    break;
  case dtLeader:
    this->m_textdisplaymode = kInLine;
    this->m_userpositionedtext = false;
    iVar3 = 2;
    goto LAB_004b5e35;
  case dtTextBlock:
  case dtDimOrdinate:
    break;
  default:
    this->m_textdisplaymode = kNormal;
    bVar1 = false;
  }
  this->m_textdisplaymode = kNormal;
  this->m_userpositionedtext = bVar1;
LAB_004b5e62:
  iVar3 = ON_3dmAnnotationContext::V5_ArchiveDimStyleIndex(local_b8);
  SetV5_3dmArchiveDimStyleIndex(this,iVar3);
  ON_wString::~ON_wString(&local_e0);
  return;
}

Assistant:

void ON_OBSOLETE_V5_Annotation::Internal_InitializeFromV2Annotation(
  const class ON_OBSOLETE_V2_Annotation& V2_annotation,
  const class ON_3dmAnnotationContext* annotation_context
)
{
  if (nullptr == annotation_context)
    annotation_context = &ON_3dmAnnotationContext::Default;

  //const ON_3dmAnnotationSettings& annotation_settings = annotation_context->AnnotationSettings();

  SetTextFormula(nullptr);

  ON_wString text
    = (V2_annotation.m_usertext.IsNotEmpty())
    ? V2_annotation.m_usertext
    : V2_annotation.m_defaulttext;
  text.TrimLeftAndRight();

  SetTextValue(text);

  // 30 Oct 2013 - Lowell - changed to copy the number of points in V2_annotation.PointCount() instead of always 5
  const int V2_point_count = V2_annotation.PointCount();
  const ON_2dVector v
    = (V2_point_count > 0 && V2_annotation.m_points[0].IsValid() && ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimAngular != V2_annotation.m_type)
    ? (ON_2dPoint::Origin - V2_annotation.m_points[0])
    : ON_2dVector::ZeroVector;

  m_points.SetCount(0);
  m_points.Reserve(V2_point_count);
  if (V2_point_count > 0)
    m_points.Append(ON_2dPoint::Origin);
  for (int i = 1; i < V2_point_count; i++)
  {
    const ON_2dPoint V2_point = V2_annotation.Point(i);
    ON_2dPoint v5_point
      = V2_point.IsValid()
      ? V2_point + v
      : V2_point;
    SetPoint(i, v5_point);
  }

  m_plane = V2_annotation.Plane();
  m_plane.UpdateEquation();
  if (false == m_plane.IsValid())
    m_plane = ON_Plane::World_xy;
  else if (v.IsNotZero())
  {
    m_plane.origin = m_plane.PointAt(-v.x, -v.y);
    m_plane.UpdateEquation();
  }

  m_textheight = 1.0;

  ON_INTERNAL_OBSOLETE::V5_TextDisplayMode text_display_mode = ON_INTERNAL_OBSOLETE::V5_TextDisplayMode::kNormal;
  bool bUserPositionedText = false;
  int min_point_count = -1;
  int max_point_count = -1;

  switch (V2_annotation.m_type)
  {
  case ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtNothing:
    m_textdisplaymode = ON_INTERNAL_OBSOLETE::V5_TextDisplayMode::kNormal;
    break;

  case ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimLinear:
  case ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimAligned:
    text_display_mode = ON_INTERNAL_OBSOLETE::V5_TextDisplayMode::kAboveLine;
    min_point_count = ON_OBSOLETE_V5_DimLinear::dim_pt_count;
    max_point_count = ON_OBSOLETE_V5_DimLinear::dim_pt_count;
    break;
  case ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimAngular:
    bUserPositionedText = V2_annotation.UserPositionedText() ? true : false;
    text_display_mode = ON_INTERNAL_OBSOLETE::V5_TextDisplayMode::kAboveLine;
    min_point_count = 2;
    max_point_count = 3;
    break;
  case ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimDiameter:
    bUserPositionedText = V2_annotation.UserPositionedText() ? true : false;
    break;
  case ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimRadius:
    bUserPositionedText = V2_annotation.UserPositionedText() ? true : false;
    break;

  case ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtLeader:
    bUserPositionedText = false;
    text_display_mode = ON_INTERNAL_OBSOLETE::V5_TextDisplayMode::kInLine;
    min_point_count = 2;
    break;

  case ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtTextBlock:
    break;

  case ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimOrdinate:
    break;

  default:
    m_textdisplaymode = ON_INTERNAL_OBSOLETE::V5_TextDisplayMode::kNormal;
    break;
  }

  m_textdisplaymode = text_display_mode;
  m_userpositionedtext = bUserPositionedText;

  if (max_point_count > 0 && max_point_count >= min_point_count && m_points.Count() > max_point_count)
    m_points.SetCount(max_point_count);
  else if (min_point_count >= 0 && m_points.Count() < min_point_count)
    m_points.SetCount(0);

  SetV5_3dmArchiveDimStyleIndex(annotation_context->V5_ArchiveDimStyleIndex());
}